

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx2.cpp
# Opt level: O3

int __thiscall
ncnn::Cast_x86_avx2::forward(Cast_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int _elempack;
  int *piVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 (*pauVar7) [32];
  _func_int **pp_Var8;
  int iVar9;
  _func_int *p_Var10;
  ulong uVar11;
  long lVar12;
  undefined1 (*pauVar13) [16];
  undefined1 (*pauVar14) [32];
  undefined1 (*pauVar15) [16];
  ulong uVar16;
  int iVar17;
  size_t _elemsize;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar33 [32];
  m128i fp16;
  m256i mask;
  undefined1 local_b0 [16];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar32 [32];
  
  p_Var10 = this->_vptr_Cast_x86_avx2[-3];
  if (*(int *)(&this->field_0xd0 + (long)p_Var10) == *(int *)(&this->field_0xd4 + (long)p_Var10)) {
    if (top_blob != bottom_blob) {
      piVar3 = bottom_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar3 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar3;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar9 = bottom_blob->w;
      iVar17 = bottom_blob->h;
      iVar1 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar9;
      top_blob->h = iVar17;
      top_blob->d = iVar1;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    return 0;
  }
  iVar9 = bottom_blob->w;
  iVar17 = bottom_blob->h;
  iVar1 = bottom_blob->d;
  uVar20 = bottom_blob->c;
  uVar11 = (ulong)uVar20;
  iVar2 = bottom_blob->dims;
  _elempack = bottom_blob->elempack;
  _elemsize = (size_t)_elempack;
  switch(*(int *)(&this->field_0xd4 + (long)p_Var10)) {
  case 1:
    if (*(int *)(&this->field_0xd0 + (long)p_Var10) == 3) {
      Cast::forward((Cast *)((long)&this->_vptr_Cast_x86_avx2 + (long)p_Var10),bottom_blob,top_blob,
                    opt);
    }
    _elemsize = _elemsize * 4;
    break;
  case 2:
  case 4:
    _elemsize = (size_t)(_elempack * 2);
    break;
  case 3:
    break;
  default:
    _elemsize = bottom_blob->elemsize;
  }
  switch(iVar2) {
  case 1:
    Mat::create(top_blob,iVar9,_elemsize,_elempack,opt->blob_allocator);
    break;
  case 2:
    Mat::create(top_blob,iVar9,iVar17,_elemsize,_elempack,opt->blob_allocator);
    break;
  case 3:
    Mat::create(top_blob,iVar9,iVar17,uVar20,_elemsize,_elempack,opt->blob_allocator);
    break;
  case 4:
    Mat::create(top_blob,iVar9,iVar17,iVar1,uVar20,_elemsize,_elempack,opt->blob_allocator);
  }
  auVar28 = in_ZMM5._0_16_;
  auVar22 = in_ZMM3._0_32_;
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  uVar19 = iVar1 * _elempack * iVar17 * iVar9;
  pp_Var8 = this->_vptr_Cast_x86_avx2;
  p_Var10 = pp_Var8[-3];
  iVar9 = *(int *)(&this->field_0xd0 + (long)p_Var10);
  iVar17 = (int)uVar19 >> 3;
  if (iVar9 == 1) {
    if (*(int *)(&this->field_0xd4 + (long)p_Var10) != 2) goto LAB_0030ed32;
    local_a0 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    uVar18 = uVar19 & 7;
    if (uVar18 != 0) {
      lVar12 = (ulong)uVar18 - 1;
      auVar24._8_8_ = 0x8000000000000000;
      auVar24._0_8_ = 0x8000000000000000;
      auVar24._16_8_ = 0x8000000000000000;
      auVar24._24_8_ = 0x8000000000000000;
      auVar22._8_8_ = lVar12;
      auVar22._0_8_ = lVar12;
      auVar22._16_8_ = lVar12;
      auVar22._24_8_ = lVar12;
      auVar23 = vpcmpgtq_avx2(_DAT_0032f200,auVar22 ^ auVar24);
      auVar22 = vpcmpgtq_avx2(_DAT_0032f1e0,auVar22 ^ auVar24);
      auVar22 = vpackssdw_avx2(auVar22,auVar23);
      auVar23 = vpcmpeqd_avx2(auVar23,auVar23);
      auVar28 = vpackssdw_avx(SUB3216(auVar22 ^ auVar23,0),SUB3216(auVar22 ^ auVar23,0x10));
      auVar28 = vpshufd_avx(auVar28,0xd8);
      auVar22 = vpmovzxwd_avx2(auVar28);
      auVar22 = vpslld_avx2(auVar22,0x1f);
      auVar23._8_4_ = 0x80000000;
      auVar23._0_8_ = 0x8000000080000000;
      auVar23._12_4_ = 0x80000000;
      auVar23._16_4_ = 0x80000000;
      auVar23._20_4_ = 0x80000000;
      auVar23._24_4_ = 0x80000000;
      auVar23._28_4_ = 0x80000000;
      local_a0 = vpmaskmovd_avx2(auVar22,auVar23);
    }
    if ((int)uVar20 < 1) {
      iVar9 = 1;
    }
    else {
      uVar21 = 0;
      do {
        pauVar7 = (undefined1 (*) [32])
                  (bottom_blob->cstep * uVar21 * bottom_blob->elemsize + (long)bottom_blob->data);
        pauVar13 = (undefined1 (*) [16])
                   (top_blob->cstep * uVar21 * top_blob->elemsize + (long)top_blob->data);
        iVar9 = iVar17;
        if (0 < iVar17) {
          do {
            auVar28 = vcvtps2ph_f16c(*pauVar7,3);
            *pauVar13 = auVar28;
            pauVar7 = pauVar7 + 1;
            pauVar13 = pauVar13 + 1;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        if (uVar18 != 0) {
          auVar22 = vmaskmovps_avx(local_a0,*pauVar7);
          local_b0 = vcvtps2ph_f16c(auVar22,3);
          in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
          in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
          memcpy(pauVar13,local_b0,(ulong)(uVar18 * 2));
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 != uVar11);
      pp_Var8 = this->_vptr_Cast_x86_avx2;
      p_Var10 = pp_Var8[-3];
      iVar9 = *(int *)(&this->field_0xd0 + (long)p_Var10);
    }
  }
  auVar28 = in_ZMM5._0_16_;
  auVar22 = in_ZMM3._0_32_;
  if (iVar9 == 2) {
    if (*(int *)(&this->field_0xd4 + (long)p_Var10) != 1) {
      return 0;
    }
    local_a0 = ZEXT1632(ZEXT816(0));
    if ((uVar19 & 7) != 0) {
      lVar12 = (ulong)(uVar19 & 7) - 1;
      auVar30._8_8_ = 0x8000000000000000;
      auVar30._0_8_ = 0x8000000000000000;
      auVar30._16_8_ = 0x8000000000000000;
      auVar30._24_8_ = 0x8000000000000000;
      auVar29._8_8_ = lVar12;
      auVar29._0_8_ = lVar12;
      auVar29._16_8_ = lVar12;
      auVar29._24_8_ = lVar12;
      auVar24 = vpcmpgtq_avx2(_DAT_0032f200,auVar29 ^ auVar30);
      auVar23 = vpcmpgtq_avx2(_DAT_0032f1e0,auVar29 ^ auVar30);
      auVar23 = vpackssdw_avx2(auVar23,auVar24);
      auVar24 = vpcmpeqd_avx2(auVar24,auVar24);
      auVar27 = vpackssdw_avx(SUB3216(auVar23 ^ auVar24,0),SUB3216(auVar23 ^ auVar24,0x10));
      auVar27 = vpshufd_avx(auVar27,0xd8);
      auVar23 = vpmovzxwd_avx2(auVar27);
      auVar23 = vpslld_avx2(auVar23,0x1f);
      auVar25._8_4_ = 0x80000000;
      auVar25._0_8_ = 0x8000000080000000;
      auVar25._12_4_ = 0x80000000;
      auVar25._16_4_ = 0x80000000;
      auVar25._20_4_ = 0x80000000;
      auVar25._24_4_ = 0x80000000;
      auVar25._28_4_ = 0x80000000;
      local_a0 = vpmaskmovd_avx2(auVar23,auVar25);
    }
    if (0 < (int)uVar20) {
      local_80 = local_a0;
      uVar21 = 0;
      do {
        pauVar13 = (undefined1 (*) [16])
                   (bottom_blob->cstep * uVar21 * bottom_blob->elemsize + (long)bottom_blob->data);
        pauVar7 = (undefined1 (*) [32])
                  (top_blob->cstep * uVar21 * top_blob->elemsize + (long)top_blob->data);
        iVar9 = iVar17;
        if (0 < iVar17) {
          do {
            auVar28 = vlddqu_avx(*pauVar13);
            auVar22 = vcvtph2ps_f16c(auVar28);
            *pauVar7 = auVar22;
            pauVar13 = pauVar13 + 1;
            pauVar7 = pauVar7 + 1;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        if ((uVar19 & 7) != 0) {
          local_b0 = ZEXT816(0);
          in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
          in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
          memcpy(local_b0,pauVar13,(ulong)((uVar19 & 7) * 2));
          auVar22 = vcvtph2ps_f16c(local_b0);
          auVar22 = vmaskmovps_avx(local_80,auVar22);
          *pauVar7 = auVar22;
        }
        auVar28 = in_ZMM5._0_16_;
        auVar22 = in_ZMM3._0_32_;
        uVar21 = uVar21 + 1;
      } while (uVar21 != uVar11);
      pp_Var8 = this->_vptr_Cast_x86_avx2;
    }
    p_Var10 = pp_Var8[-3];
    iVar9 = *(int *)(&this->field_0xd0 + (long)p_Var10);
  }
  if (iVar9 == 4) {
    if ((int)uVar20 < 1 || *(int *)(&this->field_0xd4 + (long)p_Var10) != 1) {
      return 0;
    }
    uVar21 = 0;
    do {
      pauVar13 = (undefined1 (*) [16])
                 (bottom_blob->cstep * uVar21 * bottom_blob->elemsize + (long)bottom_blob->data);
      pauVar15 = (undefined1 (*) [16])
                 (top_blob->cstep * uVar21 * top_blob->elemsize + (long)top_blob->data);
      uVar18 = iVar17 + 1;
      if (0 < iVar17) {
        do {
          auVar27 = vlddqu_avx(*pauVar13);
          auVar31 = vpunpcklwd_avx((undefined1  [16])0x0,auVar27);
          auVar27 = vpunpckhwd_avx((undefined1  [16])0x0,auVar27);
          pauVar15[1] = auVar27;
          *pauVar15 = auVar31;
          pauVar13 = pauVar13 + 1;
          pauVar15 = pauVar15 + 2;
          uVar18 = uVar18 - 1;
        } while (1 < uVar18);
      }
      if ((uVar19 & 7) != 0) {
        lVar12 = 0;
        iVar9 = (uVar19 & 7) + 1;
        do {
          *(uint *)(*pauVar15 + lVar12 * 2) = (uint)*(ushort *)(*pauVar13 + lVar12) << 0x10;
          iVar9 = iVar9 + -1;
          lVar12 = lVar12 + 2;
        } while (1 < iVar9);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar11);
    p_Var10 = pp_Var8[-3];
    iVar9 = *(int *)(&this->field_0xd0 + (long)p_Var10);
  }
  if (iVar9 != 1) {
    return 0;
  }
LAB_0030ed32:
  if (0 < (int)uVar20 && *(int *)(&this->field_0xd4 + (long)p_Var10) == 4) {
    uVar20 = uVar19 & 0xf;
    uVar21 = 0;
    auVar23 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar24 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar26._8_8_ = 0x8000000000000000;
    auVar26._0_8_ = 0x8000000000000000;
    auVar26._16_8_ = 0x8000000000000000;
    auVar26._24_8_ = 0x8000000000000000;
    auVar22 = vpcmpeqd_avx2(auVar22,auVar22);
    auVar27._8_8_ = 0x8000000000000000;
    auVar27._0_8_ = 0x8000000000000000;
    auVar28 = vpcmpeqd_avx(auVar28,auVar28);
    do {
      pauVar7 = (undefined1 (*) [32])
                (bottom_blob->cstep * uVar21 * bottom_blob->elemsize + (long)bottom_blob->data);
      pauVar14 = (undefined1 (*) [32])
                 (top_blob->cstep * uVar21 * top_blob->elemsize + (long)top_blob->data);
      uVar18 = ((int)uVar19 >> 4) + 1;
      if (0 < (int)uVar19 >> 4) {
        do {
          auVar29 = vpsrld_avx2(*pauVar7,0x10);
          auVar30 = vpsrld_avx2(pauVar7[1],0x10);
          auVar29 = vpackusdw_avx2(auVar29,auVar30);
          auVar29 = vpermq_avx2(auVar29,0xd8);
          *pauVar14 = auVar29;
          pauVar7 = pauVar7 + 2;
          pauVar14 = pauVar14 + 1;
          uVar18 = uVar18 - 1;
        } while (1 < uVar18);
      }
      uVar18 = uVar20;
      if (7 < uVar20) {
        auVar29 = vpsrld_avx2(*pauVar7,0x10);
        auVar31 = vpackusdw_avx(auVar29._0_16_,auVar29._16_16_);
        *(undefined1 (*) [16])*pauVar14 = auVar31;
        pauVar7 = pauVar7 + 1;
        pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
        uVar18 = uVar20 - 8;
      }
      if (0 < (int)uVar18) {
        lVar12 = (ulong)uVar18 - 1;
        auVar31._8_8_ = lVar12;
        auVar31._0_8_ = lVar12;
        auVar32._16_8_ = lVar12;
        auVar32._0_16_ = auVar31;
        auVar32._24_8_ = lVar12;
        uVar16 = 0;
        do {
          auVar33._8_8_ = uVar16;
          auVar33._0_8_ = uVar16;
          auVar33._16_8_ = uVar16;
          auVar33._24_8_ = uVar16;
          auVar6 = vpor_avx2(auVar33,auVar23);
          auVar33 = vpor_avx2(auVar33,auVar24);
          auVar30 = vpcmpgtq_avx2(auVar33 ^ auVar26,auVar32 ^ auVar26);
          auVar25 = vpcmpgtq_avx2(auVar6 ^ auVar26,auVar32 ^ auVar26);
          auVar29 = vpackssdw_avx2(auVar25,auVar30);
          auVar4 = vpackssdw_avx(SUB3216(auVar29 ^ auVar22,0),SUB3216(auVar29 ^ auVar22,0x10));
          auVar5 = vpshufd_avx(auVar4,0xd8);
          auVar29 = vpmovzxwd_avx2(auVar5);
          auVar29 = vpslld_avx2(auVar29,0x1f);
          auVar29 = vpmaskmovd_avx2(auVar29,*(undefined1 (*) [32])(*pauVar7 + uVar16 * 4));
          if ((auVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)(*pauVar14 + uVar16 * 2) = auVar29._2_2_;
          }
          auVar4 = vpcmpgtq_avx(auVar6._0_16_ ^ auVar27,auVar31 ^ auVar27);
          auVar4 = vpackssdw_avx(auVar4,auVar4);
          auVar4 = vpackssdw_avx(auVar4 ^ auVar28,auVar4 ^ auVar28);
          if ((auVar4 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)(*pauVar14 + uVar16 * 2 + 2) = auVar29._6_2_;
          }
          auVar6 = vpackssdw_avx2(auVar25,auVar23);
          auVar4 = auVar6._16_16_ ^ auVar28;
          auVar4 = vpackssdw_avx(auVar4,auVar4);
          if ((auVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)(*pauVar14 + uVar16 * 2 + 4) = auVar29._10_2_;
          }
          auVar25 = vpackssdw_avx2(auVar25,auVar23);
          auVar4 = auVar25._16_16_ ^ auVar28;
          auVar4 = vpackssdw_avx(auVar4,auVar4);
          if ((auVar4 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)(*pauVar14 + uVar16 * 2 + 6) = auVar29._14_2_;
          }
          auVar4 = vpcmpgtq_avx(auVar33._0_16_ ^ auVar27,auVar31 ^ auVar27);
          auVar4 = vpackssdw_avx(auVar4,auVar4);
          auVar4 = vpackssdw_avx(auVar4 ^ auVar28,auVar4 ^ auVar28);
          if ((auVar4 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)(*pauVar14 + uVar16 * 2 + 8) = auVar29._18_2_;
          }
          auVar4 = vpcmpgtq_avx(auVar33._0_16_ ^ auVar27,auVar31 ^ auVar27);
          auVar4 = vpackssdw_avx(auVar4,auVar4);
          auVar4 = vpackssdw_avx(auVar4 ^ auVar28,auVar4 ^ auVar28);
          if ((auVar4 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)(*pauVar14 + uVar16 * 2 + 10) = auVar29._22_2_;
          }
          auVar25 = vpackssdw_avx2(auVar23,auVar30);
          auVar4 = auVar25._16_16_ ^ auVar28;
          auVar4 = vpackssdw_avx(auVar4,auVar4);
          if ((auVar4 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)(*pauVar14 + uVar16 * 2 + 0xc) = auVar29._26_2_;
          }
          auVar30 = vpshufhw_avx2(auVar30,0x84);
          auVar4 = auVar30._16_16_ ^ auVar28;
          auVar4 = vpackssdw_avx(auVar4,auVar4);
          if ((auVar4 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)(*pauVar14 + uVar16 * 2 + 0xe) = auVar29._30_2_;
          }
          uVar16 = uVar16 + 8;
        } while ((uVar18 + 7 & 0xfffffff8) != uVar16);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar11);
  }
  return 0;
}

Assistant:

int Cast_x86_avx2::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if __AVX2__
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;
    if (type_from == 1 && type_to == 2)
    {
        int nn = size >> 3;
        int remain = size - (nn << 3);
        m256i mask = {_mm256_setzero_si256()};
        for (int i = 0; i < remain; i++)
            mask.m256i_u32[i] = 0x80000000;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);

            for (int i = 0; i < nn; i++)
            {
                __m256 fp32 = _mm256_loadu_ps(ptr);
                __m128i fp16 = _mm256_cvtps_ph(fp32, _MM_FROUND_TRUNC);
                _mm_store_si128((__m128i*)outptr, fp16);
                ptr += 8;
                outptr += 8;
            }

            if (remain > 0)
            {
                __m256 fp32 = _mm256_maskload_ps(ptr, mask.vec);
                m128i fp16 = {_mm256_cvtps_ph(fp32, _MM_FROUND_TRUNC)};
                memcpy(outptr, fp16.m128i_u16, remain * sizeof(unsigned short));
            }
        }
    }

    if (type_from == 2 && type_to == 1)
    {
        int nn = size >> 3;
        int remain = size - (nn << 3);
        m256i mask = {_mm256_setzero_si256()};
        for (int i = 0; i < remain; i++)
            mask.m256i_u32[i] = 0x80000000;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < nn; i++)
            {
                __m128i fp16 = _mm_lddqu_si128((__m128i const*)ptr);
                __m256 fp32 = _mm256_cvtph_ps(fp16);
                _mm256_storeu_ps(outptr, fp32);
                ptr += 8;
                outptr += 8;
            }

            if (remain > 0)
            {
                m128i fp16 = {_mm_setzero_si128()};
                memcpy(fp16.m128i_u16, ptr, remain * sizeof(unsigned short));
                __m256 fp32 = _mm256_cvtph_ps(fp16.vec);
                _mm256_maskstore_ps(outptr, mask.vec, fp32);
            }
        }
    }
    if (type_from == 4 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            int nn = size >> 3;
            int remain = size & 7;
            for (; nn > 0; nn--)
            {
                _mm256_storeu_ps(outptr, bfloat2float_avx(_mm_lddqu_si128((__m128i const*)ptr)));
                ptr += 8;
                outptr += 8;
            }

            for (; remain > 0; remain--)
            {
                *outptr = bfloat16_to_float32(*ptr);
                outptr++;
                ptr++;
            }
        }
    }
    if (type_from == 1 && type_to == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);
            int nn = size >> 4;
            int remain = size & 15;
            for (; nn > 0; nn--)
            {
                _mm256_storeu_si256((__m256i*)outptr, float2bfloat_avx(_mm256_loadu_ps(ptr), _mm256_loadu_ps(ptr + 8)));
                ptr += 16;
                outptr += 16;
            }
            if (remain >= 8)
            {
                remain -= 8;
                _mm_store_si128((__m128i*)outptr, float2bfloat_avx(_mm256_loadu_ps(ptr)));
                ptr += 8;
                outptr += 8;
            }
            for (; remain > 0; remain--)
            {
                *outptr = float32_to_bfloat16(*ptr);
                outptr++;
                ptr++;
            }
        }
    }

    return 0;
#else // __AVX__

    return Cast::forward(bottom_blob, top_blob, opt);

#endif // __AVX__
}